

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImGuiContext *pIVar3;
  ImU32 IVar4;
  undefined7 in_register_00000031;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImVec2 local_60;
  ImVec2 p_max_local;
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  local_50.x = p_min.x + 1.0;
  local_50.y = p_min.y + 0.0;
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = p_max;
  local_48._12_4_ = in_XMM1_Dd;
  local_60.x = p_max.x + -0.1;
  local_60.y = p_max.y + -0.1;
  p_max_local = p_max;
  ImDrawList::AddRectFilled(pIVar1->DrawList,&local_50,&local_60,fill_col,rounding,0xf);
  if (((int)CONCAT71(in_register_00000031,border) != 0) &&
     (thickness = (pIVar3->Style).FrameBorderSize, 0.0 < thickness)) {
    pIVar2 = pIVar1->DrawList;
    local_60.x = local_50.x + 1.0;
    local_60.y = local_50.y + 1.0;
    local_38.x = (float)local_48._0_4_ + 1.0;
    local_38.y = (float)local_48._4_4_ + 1.0;
    IVar4 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar2,&local_60,&local_38,IVar4,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    IVar4 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar2,&local_50,&p_max_local,IVar4,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    //window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    p_min = p_min + ImVec2(1.0, 0.0);
    window->DrawList->AddRectFilled(p_min, p_max-ImVec2(+0.1,0.1), fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}